

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::_q_updateButtonStates(QWizardPrivate *this)

{
  QWizard *this_00;
  ulong uVar1;
  QWidget *this_01;
  QAbstractButton *pQVar2;
  byte bVar3;
  bool bVar4;
  undefined1 uVar5;
  QWizardPage *pQVar6;
  QWizardPage *pQVar7;
  QPushButton *pQVar8;
  byte bVar9;
  uint uVar10;
  bool bVar11;
  
  this_00 = *(QWizard **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  pQVar6 = QWizard::currentPage(this_00);
  if (pQVar6 == (QWizardPage *)0x0) {
    bVar3 = 0;
  }
  else {
    bVar3 = (**(code **)(*(long *)&pQVar6->super_QWidget + 0x1b8))(pQVar6);
  }
  uVar1 = (this->history).d.size;
  this_01 = &((this->field_20).btn.back)->super_QWidget;
  if (1 < uVar1) {
    pQVar7 = QWizard::page(this_00,(this->history).d.ptr[uVar1 - 2]);
    if (*(char *)(*(long *)&(pQVar7->super_QWidget).field_0x8 + 0x30d) == '\0') {
      bVar4 = true;
      if (this->canFinish == true) {
        bVar4 = ((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                 super_QFlagsStorage<QWizard::WizardOption>.i & 0x40) == 0;
      }
      goto LAB_004c1778;
    }
  }
  bVar4 = false;
LAB_004c1778:
  QWidget::setEnabled(this_01,bVar4);
  QWidget::setEnabled(&((this->field_20).btn.next)->super_QWidget,(bool)(this->canContinue & bVar3))
  ;
  QWidget::setEnabled(&((this->field_20).btn.commit)->super_QWidget,
                      (bool)(this->canContinue & bVar3));
  QWidget::setEnabled(&((this->field_20).btn.finish)->super_QWidget,(bool)(bVar3 & this->canFinish))
  ;
  bVar11 = false;
  bVar4 = buttonLayoutContains(this,BackButton);
  if (bVar4) {
    if (((ulong)(this->history).d.size < 2) &&
       (((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
         super_QFlagsStorage<QWizard::WizardOption>.i & 0x10) != 0)) {
      bVar11 = false;
    }
    else {
      bVar11 = true;
      if (this->canContinue == false) {
        bVar11 = ((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                  super_QFlagsStorage<QWizard::WizardOption>.i & 0x20) == 0;
      }
    }
  }
  if (pQVar6 == (QWizardPage *)0x0) {
    bVar3 = 0;
  }
  else {
    bVar3 = *(byte *)(*(long *)&(pQVar6->super_QWidget).field_0x8 + 0x30d);
  }
  pQVar2 = (this->field_20).btn.back;
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,bVar11);
  pQVar2 = (this->field_20).btn.next;
  bVar4 = buttonLayoutContains(this,NextButton);
  bVar9 = 0;
  if (((bVar3 == 0) && (bVar4)) && (bVar9 = 1, this->canContinue == false)) {
    bVar9 = (byte)(this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                  super_QFlagsStorage<QWizard::WizardOption>.i >> 7;
  }
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,bVar9);
  pQVar2 = (this->field_20).btn.commit;
  bVar4 = buttonLayoutContains(this,CommitButton);
  if ((bVar4 & bVar3) == 1) {
    uVar5 = this->canContinue;
  }
  else {
    uVar5 = 0;
  }
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,uVar5);
  pQVar2 = (this->field_20).btn.finish;
  bVar4 = buttonLayoutContains(this,FinishButton);
  if (bVar4) {
    bVar9 = 1;
    if (this->canFinish == false) {
      bVar9 = *(byte *)((long)&(this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                               super_QFlagsStorage<QWizard::WizardOption>.i + 1) & 1;
    }
  }
  else {
    bVar9 = 0;
  }
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,bVar9);
  uVar10 = (this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
           super_QFlagsStorage<QWizard::WizardOption>.i;
  if ((uVar10 >> 9 & 1) == 0) {
    pQVar2 = (this->field_20).btn.cancel;
    bVar4 = buttonLayoutContains(this,CancelButton);
    if (bVar4) {
      bVar4 = true;
      if (this->canContinue == false) {
        bVar4 = ((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
                 super_QFlagsStorage<QWizard::WizardOption>.i & 0x10000) == 0;
      }
    }
    else {
      bVar4 = false;
    }
    (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,bVar4);
    uVar10 = (this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
             super_QFlagsStorage<QWizard::WizardOption>.i;
  }
  pQVar8 = QtPrivate::qobject_cast_helper<QPushButton*,QObject>
                     ((QObject *)(this->field_20).btn.next);
  if (pQVar8 != (QPushButton *)0x0) {
    QPushButton::setDefault(pQVar8,(bool)((uVar10 & 8) == 0 & this->canContinue & (bVar3 ^ 1)));
  }
  pQVar8 = QtPrivate::qobject_cast_helper<QPushButton*,QObject>
                     ((QObject *)(this->field_20).btn.commit);
  if (pQVar8 != (QPushButton *)0x0) {
    QPushButton::setDefault(pQVar8,(bool)((uVar10 & 8) == 0 & this->canContinue & bVar3));
  }
  pQVar8 = QtPrivate::qobject_cast_helper<QPushButton*,QObject>
                     ((QObject *)(this->field_20).btn.finish);
  if (pQVar8 != (QPushButton *)0x0) {
    QPushButton::setDefault(pQVar8,(bool)((this->canContinue ^ 1U) & (uVar10 & 8) == 0));
  }
  enableUpdates(this);
  return;
}

Assistant:

void QWizardPrivate::_q_updateButtonStates()
{
    Q_Q(QWizard);

    disableUpdates();

    const QWizardPage *page = q->currentPage();
    bool complete = page && page->isComplete();

    btn.back->setEnabled(history.size() > 1
                         && !q->page(history.at(history.size() - 2))->isCommitPage()
                         && (!canFinish || !(opts & QWizard::DisabledBackButtonOnLastPage)));
    btn.next->setEnabled(canContinue && complete);
    btn.commit->setEnabled(canContinue && complete);
    btn.finish->setEnabled(canFinish && complete);

    const bool backButtonVisible = buttonLayoutContains(QWizard::BackButton)
        && (history.size() > 1 || !(opts & QWizard::NoBackButtonOnStartPage))
        && (canContinue || !(opts & QWizard::NoBackButtonOnLastPage));
    bool commitPage = page && page->isCommitPage();
    btn.back->setVisible(backButtonVisible);
    btn.next->setVisible(buttonLayoutContains(QWizard::NextButton) && !commitPage
                         && (canContinue || (opts & QWizard::HaveNextButtonOnLastPage)));
    btn.commit->setVisible(buttonLayoutContains(QWizard::CommitButton) && commitPage
                           && canContinue);
    btn.finish->setVisible(buttonLayoutContains(QWizard::FinishButton)
                           && (canFinish || (opts & QWizard::HaveFinishButtonOnEarlyPages)));

    if (!(opts & QWizard::NoCancelButton))
        btn.cancel->setVisible(buttonLayoutContains(QWizard::CancelButton)
                               && (canContinue || !(opts & QWizard::NoCancelButtonOnLastPage)));

    bool useDefault = !(opts & QWizard::NoDefaultButton);
    if (QPushButton *nextPush = qobject_cast<QPushButton *>(btn.next))
        nextPush->setDefault(canContinue && useDefault && !commitPage);
    if (QPushButton *commitPush = qobject_cast<QPushButton *>(btn.commit))
        commitPush->setDefault(canContinue && useDefault && commitPage);
    if (QPushButton *finishPush = qobject_cast<QPushButton *>(btn.finish))
        finishPush->setDefault(!canContinue && useDefault);

#if QT_CONFIG(style_windowsvista)
    if (isVistaThemeEnabled()) {
        vistaHelper->backButton()->setEnabled(btn.back->isEnabled());
        vistaHelper->backButton()->setVisible(backButtonVisible);
        btn.back->setVisible(false);
    }
#endif

    enableUpdates();
}